

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

_Bool mpack_tree_reserve_bytes(mpack_tree_parser_t *parser,size_t bytes)

{
  mpack_tree_t *pmVar1;
  ulong uVar2;
  _Bool _Var3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  mpack_tree_error_t p_Var8;
  ulong uVar9;
  mpack_error_t mVar10;
  mpack_tree_t *pmVar11;
  
  sVar4 = parser->possible_nodes_left - bytes;
  if (parser->possible_nodes_left < bytes) {
    pmVar11 = parser->tree;
    uVar5 = pmVar11->data_length + bytes;
    uVar7 = pmVar11->max_size;
    if (uVar7 < uVar5) {
      if (pmVar11->error == mpack_ok) {
        pmVar11->error = mpack_error_too_big;
        p_Var8 = pmVar11->error_fn;
        if (p_Var8 != (mpack_tree_error_t)0x0) {
          mVar10 = mpack_error_too_big;
LAB_00109601:
          (*p_Var8)(pmVar11,mVar10);
        }
      }
    }
    else {
      if (pmVar11->read_fn != (mpack_tree_read_t)0x0) {
        uVar9 = pmVar11->buffer_capacity;
        if (uVar9 < uVar5) {
          uVar2 = 0x1000;
          if (uVar9 != 0) {
            uVar2 = uVar9;
          }
          do {
            uVar9 = uVar2;
            uVar2 = uVar9 * 2;
          } while (uVar9 < uVar5);
          if (uVar9 < uVar7) {
            uVar7 = uVar9;
          }
          if (pmVar11->buffer == (char *)0x0) {
            pcVar6 = (char *)malloc(uVar7);
          }
          else {
            pcVar6 = (char *)realloc(pmVar11->buffer,uVar7);
          }
          if (pcVar6 == (char *)0x0) {
            pmVar1 = parser->tree;
            if (pmVar1->error == mpack_ok) {
              pmVar1->error = mpack_error_memory;
              if (pmVar1->error_fn != (mpack_tree_error_t)0x0) {
                (*pmVar1->error_fn)(pmVar1,mpack_error_memory);
              }
            }
          }
          else {
            pmVar11->data = pcVar6;
            pmVar11->buffer = pcVar6;
            pmVar11->buffer_capacity = uVar7;
          }
          if (pcVar6 == (char *)0x0) goto LAB_00109603;
        }
        do {
          sVar4 = (*pmVar11->read_fn)(pmVar11,pmVar11->buffer + pmVar11->data_length,
                                      pmVar11->buffer_capacity - pmVar11->data_length);
          if (pmVar11->error != mpack_ok) goto LAB_00109603;
          if (sVar4 + 1 < 2) {
            pmVar11 = parser->tree;
            if (pmVar11->error != mpack_ok) goto LAB_00109603;
            pmVar11->error = mpack_error_io;
            p_Var8 = pmVar11->error_fn;
            if (p_Var8 == (mpack_tree_error_t)0x0) goto LAB_00109603;
            mVar10 = mpack_error_io;
            goto LAB_00109601;
          }
          pmVar11->data_length = pmVar11->data_length + sVar4;
          uVar7 = sVar4 + parser->possible_nodes_left;
          parser->possible_nodes_left = uVar7;
          sVar4 = uVar7 - bytes;
        } while (uVar7 < bytes);
        goto LAB_001095dc;
      }
      if (pmVar11->error == mpack_ok) {
        pmVar11->error = mpack_error_invalid;
        p_Var8 = pmVar11->error_fn;
        if (p_Var8 != (mpack_tree_error_t)0x0) {
          mVar10 = mpack_error_invalid;
          goto LAB_00109601;
        }
      }
    }
LAB_00109603:
    _Var3 = false;
  }
  else {
LAB_001095dc:
    parser->possible_nodes_left = sVar4;
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

MPACK_STATIC_INLINE bool mpack_tree_reserve_bytes(mpack_tree_parser_t* parser, size_t bytes) {
    if (bytes <= parser->possible_nodes_left) {
        parser->possible_nodes_left -= bytes;
        return true;
    }

    #ifdef MPACK_MALLOC
    return mpack_tree_reserve_fill(parser, bytes);
    #else
    mpack_tree_flag_error(parser->tree, mpack_error_invalid);
    return false;
    #endif
}